

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory.cpp
# Opt level: O1

int main(void)

{
  const_iterator cVar1;
  unique_ptr<Tea,_std::default_delete<Tea>_> tea;
  DrinkWithVolumeFactory dwv;
  DrinkFactory df;
  long *local_b0 [2];
  long local_a0 [2];
  undefined1 local_90 [16];
  undefined1 local_80 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_48;
  
  make_drink<Tea>();
  DrinkFactory::DrinkFactory((DrinkFactory *)&local_48);
  local_80._0_8_ = (_Hash_node_base *)(local_80 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"coffee","");
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_48,(key_type *)local_80);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_b0[0] = (long *)0x0;
  }
  else {
    (**(code **)**(undefined8 **)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_true>
                         ._M_cur + 0x28))(local_b0);
  }
  (**(code **)*local_b0[0])(0x42c80000);
  if (local_b0[0] != (long *)0x0) {
    operator_delete(local_b0[0],8);
  }
  local_b0[0] = (long *)0x0;
  if ((_Hash_node_base *)local_80._0_8_ != (_Hash_node_base *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  DrinkWithVolumeFactory::DrinkWithVolumeFactory((DrinkWithVolumeFactory *)local_80);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"tea","");
  DrinkWithVolumeFactory::make((DrinkWithVolumeFactory *)local_90,(string *)local_80);
  if ((__buckets_ptr)local_90._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_90._0_8_,8);
  }
  local_90._0_8_ = (__buckets_ptr)0x0;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_80);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_48);
  if ((void *)local_90._8_8_ != (void *)0x0) {
    operator_delete((void *)local_90._8_8_,8);
  }
  return 0;
}

Assistant:

int main()
{
	auto tea{make_drink<Tea>()};

	DrinkFactory df;
	df.make_drink("coffee")->prepare(100);
	
	DrinkWithVolumeFactory dwv;
	dwv.make("tea");

	return 0;
}